

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void deleteProcess(void)

{
  iterator __end1;
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar6;
  list<Process_*,_std::allocator<Process_*>_> *plVar7;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar8;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var9;
  list<MemBlock*,std::allocator<MemBlock*>> *plVar10;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> __carry;
  Process *process;
  int pid;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> temp;
  MemBlock *block;
  long local_630 [192];
  
  pid = 0;
  pcVar1 = strtok((char *)0x0," ");
  if (pcVar1 == (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"have no enough args");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  __isoc99_sscanf(pcVar1,"%d",&pid);
  process = (Process *)0x0;
  bVar4 = true;
  plVar7 = &processList_abi_cxx11_;
  while (plVar7 = (list<Process_*,_std::allocator<Process_*>_> *)
                  (((_List_base<Process_*,_std::allocator<Process_*>_> *)
                   &((_List_node_base *)plVar7)->_M_next)->_M_impl)._M_node.super__List_node_base.
                  _M_next, plVar7 != &processList_abi_cxx11_) {
    if ((*(Process **)((long)plVar7 + 0x10))->pid == pid) {
      bVar4 = false;
      process = *(Process **)((long)plVar7 + 0x10);
    }
  }
  if (bVar4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"no process was found with that pid!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::remove
              (&processList_abi_cxx11_,(char *)&process);
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
              (&usedMemBlockList_abi_cxx11_,(char *)&process->memBlock);
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
              (&freeMemBlockList_abi_cxx11_,&process->memBlock);
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node._M_size = 0;
      lVar3 = 0;
      do {
        lVar5 = (long)local_630 + lVar3 + -8;
        *(long *)((long)local_630 + lVar3) = lVar5;
        *(long *)lVar5 = lVar5;
        *(undefined8 *)((long)local_630 + lVar3 + 8) = 0;
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0x600);
      plVar8 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block;
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&__carry;
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)&__carry;
      do {
        plVar6 = plVar8;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::splice
                  (&__carry,(int)__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
                                 _M_impl._M_node.super__List_node_base._M_next,
                   (__off64_t *)&freeMemBlockList_abi_cxx11_,
                   (int)freeMemBlockList_abi_cxx11_.
                        super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                        super__List_node_base._M_next,in_R8,in_R9,
                   (int)__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
                        _M_node.super__List_node_base._M_next);
        for (plVar10 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block; plVar10 != plVar6;
            plVar10 = plVar10 + 0x18) {
          if (plVar10 == *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar10) {
            lVar3 = 0;
            plVar8 = plVar10;
            goto LAB_00101fdb;
          }
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>
                    (plVar10,&__carry);
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                    (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar10);
        }
        lVar3 = 0x18;
        plVar8 = plVar6;
LAB_00101fdb:
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                  (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar8);
        plVar8 = plVar6 + lVar3;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      plVar8 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block;
      while (plVar8 = plVar8 + 0x18, plVar8 != plVar6 + lVar3) {
        std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__0>(plVar8)
        ;
      }
      plVar8 = plVar6 + -0x18;
      if (plVar10 == plVar6) {
        plVar8 = plVar6;
      }
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                (&freeMemBlockList_abi_cxx11_,
                 (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar8);
      lVar3 = 0x5e8;
      do {
        std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                  ((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                   ((long)local_630 + lVar3 + -8));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                (&__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>);
    }
    temp.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node._M_size = 0;
    temp.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&temp;
    temp.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)&temp;
    while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node.super__List_node_base._M_next !=
           (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
      block = (MemBlock *)
              freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
              _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::pop_front
                (&freeMemBlockList_abi_cxx11_);
      while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
        __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
        super__List_node_base._M_next =
             freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
             _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::pop_front
                  (&freeMemBlockList_abi_cxx11_);
        if (block->start + block->length !=
            *(int *)&(__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
                      _M_node.super__List_node_base._M_next)->_M_next) {
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_front
                    (&temp,(value_type *)&__carry);
          break;
        }
        block->length =
             block->length +
             *(int *)((long)&(__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
                              _M_impl._M_node.super__List_node_base._M_next)->_M_next + 4);
        operator_delete(__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
                        _M_node.super__List_node_base._M_next);
      }
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back(&temp,&block);
    }
    std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear(&freeMemBlockList_abi_cxx11_)
    ;
    p_Var9 = (_List_node_base *)&temp;
    while (p_Var9 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var9->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)&temp) {
      block = (MemBlock *)p_Var9[1]._M_next;
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                (&freeMemBlockList_abi_cxx11_,(value_type *)&block);
    }
    operator_delete(process);
    if ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&freeMemBlockList_abi_cxx11_) &&
       ((freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
         _M_impl._M_node.super__List_node_base._M_next)->_M_next !=
        (_List_node_base *)&freeMemBlockList_abi_cxx11_)) {
      __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node._M_size = 0;
      lVar3 = 0;
      do {
        lVar5 = (long)local_630 + lVar3 + -8;
        *(long *)((long)local_630 + lVar3) = lVar5;
        *(long *)lVar5 = lVar5;
        *(undefined8 *)((long)local_630 + lVar3 + 8) = 0;
        lVar3 = lVar3 + 0x18;
        plVar8 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block;
        __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)&__carry;
        __carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
        super__List_node_base._M_prev = (_List_node_base *)&__carry;
      } while (lVar3 != 0x600);
      do {
        plVar6 = plVar8;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::splice
                  (&__carry,(int)__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
                                 _M_impl._M_node.super__List_node_base._M_next,
                   (__off64_t *)&freeMemBlockList_abi_cxx11_,
                   (int)freeMemBlockList_abi_cxx11_.
                        super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                        super__List_node_base._M_next,in_R8,in_R9,
                   (int)__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
                        _M_node.super__List_node_base._M_next);
        for (plVar10 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block; plVar10 != plVar6;
            plVar10 = plVar10 + 0x18) {
          if (plVar10 == *(list<MemBlock*,std::allocator<MemBlock*>> **)plVar10) {
            lVar3 = 0;
            plVar8 = plVar10;
            goto LAB_001021af;
          }
          std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>
                    (plVar10,&__carry);
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                    (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar10);
        }
        lVar3 = 0x18;
        plVar8 = plVar6;
LAB_001021af:
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                  (&__carry,(list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar8);
        plVar8 = plVar6 + lVar3;
      } while (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)&freeMemBlockList_abi_cxx11_);
      plVar8 = (list<MemBlock*,std::allocator<MemBlock*>> *)&block;
      while (plVar8 = plVar8 + 0x18, plVar8 != plVar6 + lVar3) {
        std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::merge<deleteProcess()::__1>(plVar8)
        ;
      }
      plVar8 = plVar6 + -0x18;
      if (plVar10 == plVar6) {
        plVar8 = plVar6;
      }
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::swap
                (&freeMemBlockList_abi_cxx11_,
                 (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)plVar8);
      lVar3 = 0x5e8;
      do {
        std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                  ((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                   ((long)local_630 + lVar3 + -8));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
                (&__carry.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>);
    }
    std::__cxx11::_List_base<MemBlock_*,_std::allocator<MemBlock_*>_>::_M_clear
              (&temp.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>);
  }
  return;
}

Assistant:

void deleteProcess() {
    // 获取参数
    int pid = 0;
    char *p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &pid);
    // 在链表中寻找具有该pid的进程
    Process *process = nullptr;
    for (Process *i : processList)
        if (i->pid == pid) process = i;
    // 如果找到了
    if (process) {
        // 将process从链表中移出
        processList.remove(process);
        // 将process用过的内存块从使用过的内存链表中移出并且加入空闲内存链表
        usedMemBlockList.remove(process->memBlock);
        freeMemBlockList.push_back(process->memBlock);
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
        // 看这些链表中有没有可以合并的项
        list<MemBlock *> temp;
        while (!freeMemBlockList.empty()) {
            MemBlock *block = freeMemBlockList.front();
            freeMemBlockList.pop_front();
            while (!freeMemBlockList.empty()) {
                MemBlock *another = freeMemBlockList.front();
                freeMemBlockList.pop_front();
                if (block->start + block->length == another->start) {
                    block->length = block->length + another->length;
                    delete another;
                } else {
                    temp.push_front(another);
                    break;
                }
            }
            temp.push_back(block);
        }
        freeMemBlockList.clear();
        for (MemBlock *i : temp) freeMemBlockList.push_back(i);
        // 删除process
        delete process;
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
    } else cout << "no process was found with that pid!" << endl;
}